

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool.cpp
# Opt level: O0

void __thiscall MppMemPoolService::put_pool(MppMemPoolService *this,MppMemPoolImpl *impl)

{
  list_head *plVar1;
  int iVar2;
  Mutex *mutex;
  undefined8 in_stack_ffffffffffffffb8;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 local_38 [8];
  AutoMutex auto_lock;
  MppMemPoolNode *m;
  MppMemPoolNode *node;
  MppMemPoolImpl *impl_local;
  MppMemPoolService *this_local;
  
  if (impl == (MppMemPoolImpl *)impl->check) {
    if (impl->finalized == 0) {
      pthread_mutex_lock((pthread_mutex_t *)&impl->lock);
      iVar2 = list_empty(&impl->unused);
      uVar4 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      if (iVar2 == 0) {
        plVar1 = (impl->unused).next;
        m = (MppMemPoolNode *)&plVar1[-1].prev;
        plVar1 = plVar1->next;
        while( true ) {
          uVar4 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
          auto_lock.mLock = (Mutex *)&plVar1[-1].prev;
          if (&m->list == &impl->unused) break;
          if (m != (MppMemPoolNode *)0x0) {
            mpp_osal_free("put_pool",m);
          }
          impl->unused_count = impl->unused_count + -1;
          m = (MppMemPoolNode *)auto_lock.mLock;
          plVar1 = *(list_head **)((long)&(auto_lock.mLock)->mMutex + 8);
        }
      }
      iVar2 = list_empty(&impl->used);
      if (iVar2 == 0) {
        sVar3 = impl->size;
        _mpp_log_l(2,"mpp_mem_pool","pool %s found %d used buffer size %d\n","put_pool",impl->caller
                   ,(ulong)(uint)impl->used_count,sVar3);
        plVar1 = (impl->used).next;
        m = (MppMemPoolNode *)&plVar1[-1].prev;
        plVar1 = plVar1->next;
        while( true ) {
          uVar4 = (undefined4)(sVar3 >> 0x20);
          auto_lock.mLock = (Mutex *)&plVar1[-1].prev;
          if (&m->list == &impl->used) break;
          if (m != (MppMemPoolNode *)0x0) {
            mpp_osal_free("put_pool",m);
          }
          impl->used_count = impl->used_count + -1;
          m = (MppMemPoolNode *)auto_lock.mLock;
          plVar1 = *(list_head **)((long)&(auto_lock.mLock)->mMutex + 8);
        }
      }
      if ((impl->used_count != 0) || (impl->unused_count != 0)) {
        _mpp_log_l(2,"mpp_mem_pool","pool %s size %d found leaked buffer used:unused [%d:%d]\n",
                   "put_pool",impl->caller,impl->size,CONCAT44(uVar4,impl->used_count),
                   impl->unused_count);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&impl->lock);
      mutex = get_lock();
      Mutex::Autolock::Autolock((Autolock *)local_38,mutex,1);
      list_del_init(&impl->service_link);
      Mutex::Autolock::~Autolock((Autolock *)local_38);
      impl->finalized = 1;
      mpp_osal_free("put_pool",impl);
    }
  }
  else {
    _mpp_log_l(2,"mpp_mem_pool","invalid mem impl %p check %p\n","put_pool",impl,impl->check);
  }
  return;
}

Assistant:

void MppMemPoolService::put_pool(MppMemPoolImpl *impl)
{
    MppMemPoolNode *node, *m;

    if (impl != impl->check) {
        mpp_err_f("invalid mem impl %p check %p\n", impl, impl->check);
        return;
    }

    if (impl->finalized)
        return;

    pthread_mutex_lock(&impl->lock);

    if (!list_empty(&impl->unused)) {
        list_for_each_entry_safe(node, m, &impl->unused, MppMemPoolNode, list) {
            MPP_FREE(node);
            impl->unused_count--;
        }
    }

    if (!list_empty(&impl->used)) {
        mpp_err_f("pool %s found %d used buffer size %d\n",
                  impl->caller, impl->used_count, impl->size);

        list_for_each_entry_safe(node, m, &impl->used, MppMemPoolNode, list) {
            MPP_FREE(node);
            impl->used_count--;
        }
    }

    if (impl->used_count || impl->unused_count)
        mpp_err_f("pool %s size %d found leaked buffer used:unused [%d:%d]\n",
                  impl->caller, impl->size, impl->used_count, impl->unused_count);

    pthread_mutex_unlock(&impl->lock);

    {
        AutoMutex auto_lock(get_lock());
        list_del_init(&impl->service_link);
    }

    impl->finalized = 1;
    mpp_free(impl);
}